

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O0

future<int> __thiscall
gmlc::concurrency::DelayedObjects<int>::getFuture(DelayedObjects<int> *this,string *name)

{
  mapped_type *this_00;
  __uniq_ptr_data<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter,_true,_true>
  in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  future<int> fVar1;
  lock_guard<std::mutex> local_58;
  lock_guard<std::mutex> lock;
  undefined1 local_38 [8];
  promise<int> V;
  string *name_local;
  DelayedObjects<int> *this_local;
  future<int> *fut;
  
  V._M_storage._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result<int>_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result<int>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter,_true,_true>
        )(__uniq_ptr_data<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter,_true,_true>
          )in_RDX.
           super___uniq_ptr_impl<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_std::__future_base::_Result<int>_*,_std::__future_base::_Result_base::_Deleter>
           .super__Head_base<0UL,_std::__future_base::_Result<int>_*,_false>._M_head_impl;
  std::promise<int>::promise((promise<int> *)local_38);
  std::promise<int>::get_future((promise<int> *)this);
  std::lock_guard<std::mutex>::lock_guard(&local_58,(mutex_type *)(name + 3));
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>_>
                          *)&name[1].field_2,
                         (key_type *)
                         V._M_storage._M_t.
                         super___uniq_ptr_impl<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__future_base::_Result<int>_*,_std::__future_base::_Result_base::_Deleter>
                         .super__Head_base<0UL,_std::__future_base::_Result<int>_*,_false>.
                         _M_head_impl);
  std::promise<int>::operator=(this_00,(promise<int> *)local_38);
  std::lock_guard<std::mutex>::~lock_guard(&local_58);
  std::promise<int>::~promise((promise<int> *)local_38);
  fVar1.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  fVar1.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (future<int>)
         fVar1.super___basic_future<int>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::future<X> getFuture(const std::string& name)
    {
        auto V = std::promise<X>();
        auto fut = V.get_future();
        std::lock_guard<std::mutex> lock(promiseLock);
        promiseByString[name] = std::move(V);
        return fut;
    }